

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdespacket.h
# Opt level: O2

ItemType __thiscall jrtplib::RTCPSDESPacket::GetItemType(RTCPSDESPacket *this)

{
  byte bVar1;
  ItemType IVar2;
  
  IVar2 = None;
  if (((this->super_RTCPPacket).knownformat == true) && (this->currentchunk != (uint8_t *)0x0)) {
    bVar1 = this->currentchunk[this->itemoffset];
    IVar2 = Unknown;
    if (bVar1 < 9) {
      IVar2 = (ItemType)bVar1;
    }
  }
  return IVar2;
}

Assistant:

inline RTCPSDESPacket::ItemType RTCPSDESPacket::GetItemType() const
{
	if (!knownformat)
		return None;
	if (currentchunk == 0)
		return None;
	RTCPSDESHeader *sdeshdr = (RTCPSDESHeader *)(currentchunk+itemoffset);
	switch (sdeshdr->sdesid)
	{
	case 0:
		return None;
	case RTCP_SDES_ID_CNAME:
		return CNAME;
	case RTCP_SDES_ID_NAME:
		return NAME;
	case RTCP_SDES_ID_EMAIL:
		return EMAIL;
	case RTCP_SDES_ID_PHONE:
		return PHONE;
	case RTCP_SDES_ID_LOCATION:
		return LOC;
	case RTCP_SDES_ID_TOOL:
		return TOOL;
	case RTCP_SDES_ID_NOTE:
		return NOTE;
	case RTCP_SDES_ID_PRIVATE:
		return PRIV;
	default:
		return Unknown;
	}
	return Unknown;
}